

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O0

String * __thiscall asl::Directory::name(String *__return_storage_ptr__,Directory *this)

{
  Path local_30;
  Directory *local_18;
  Directory *this_local;
  
  local_18 = this;
  this_local = (Directory *)__return_storage_ptr__;
  Path::Path(&local_30,&this->_path);
  Path::name(__return_storage_ptr__,&local_30);
  Path::~Path(&local_30);
  return __return_storage_ptr__;
}

Assistant:

String Directory::name() const
{
	return Path(_path).name();
}